

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

int __thiscall cmVSLink::Link(cmVSLink *this)

{
  bool bVar1;
  cmVSLink *this_local;
  
  if (((this->Incremental & 1U) == 0) ||
     (((this->LinkGeneratesManifest & 1U) == 0 &&
      (bVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::empty(&this->UserManifests), bVar1)))) {
    if ((this->Verbose & 1U) != 0) {
      if ((this->Incremental & 1U) == 0) {
        std::operator<<((ostream *)&std::cout,"Visual Studio Non-Incremental Link\n");
      }
      else {
        std::operator<<((ostream *)&std::cout,"Visual Studio Incremental Link without manifests\n");
      }
    }
    this_local._4_4_ = LinkNonIncremental(this);
  }
  else {
    if ((this->Verbose & 1U) != 0) {
      std::operator<<((ostream *)&std::cout,
                      "Visual Studio Incremental Link with embedded manifests\n");
    }
    this_local._4_4_ = LinkIncremental(this);
  }
  return this_local._4_4_;
}

Assistant:

int cmVSLink::Link()
{
  if (this->Incremental &&
      (this->LinkGeneratesManifest || !this->UserManifests.empty())) {
    if (this->Verbose) {
      std::cout << "Visual Studio Incremental Link with embedded manifests\n";
    }
    return LinkIncremental();
  }
  if (this->Verbose) {
    if (!this->Incremental) {
      std::cout << "Visual Studio Non-Incremental Link\n";
    } else {
      std::cout << "Visual Studio Incremental Link without manifests\n";
    }
  }
  return LinkNonIncremental();
}